

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O2

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset)

{
  int iVar1;
  size_type __n;
  pointer piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  unsigned_long __n2;
  size_t j;
  size_type sVar7;
  ulong uVar8;
  long lVar9;
  allocator_type local_81;
  pointer local_80;
  Data2D<int> *local_78;
  vector<int,_std::allocator<int>_> dad;
  
  __n = mset->num_dimensions;
  uVar3 = mset->cache_num_indexes;
  Data2D<int>::Data2D<int,int>(__return_storage_ptr__,(int)__n * 2,uVar3,-1);
  uVar6 = 0;
  local_78 = __return_storage_ptr__;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar6;
  }
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    local_80 = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + mset->num_dimensions * uVar6;
    ::std::vector<int,_std::allocator<int>_>::vector(&dad,__n,&local_81);
    if (__n != 0) {
      memmove(dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start,local_80,__n * 4);
    }
    lVar9 = local_78->stride * uVar6;
    piVar2 = (local_78->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (sVar7 = 0; sVar7 != __n; sVar7 = sVar7 + 1) {
      if (1 < dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[sVar7]) {
        iVar5 = local_80[sVar7];
        uVar3 = iVar5 + 1U >> 1;
        if (iVar5 < 2) {
          uVar3 = 0xffffffff;
        }
        dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [sVar7] = uVar3;
        iVar4 = MultiIndexSet::getSlot
                          (mset,dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        while ((piVar2[lVar9 + sVar7 * 2] = iVar4, iVar4 == -1 &&
               (iVar1 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar7], 1 < iVar1))) {
          dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [sVar7] = iVar1 + 1U >> 1;
          iVar4 = MultiIndexSet::getSlot
                            (mset,dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          iVar5 = iVar1;
        }
        dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [sVar7] = -(uint)(iVar5 != 2);
        if (iVar5 == 2) {
          iVar5 = MultiIndexSet::getSlot
                            (mset,dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          piVar2[lVar9 + sVar7 * 2 + 1] = iVar5;
        }
        dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [sVar7] = local_80[sVar7];
      }
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dad.super__Vector_base<int,_std::allocator<int>_>);
  }
  return local_78;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] >= level0_offset){
                    int current = p[j];
                    dad[j] = RuleLocal::getParent<effrule>(current);
                    pp[2*j] = mset.getSlot(dad);
                    while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                        current = dad[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                    }
                    dad[j] = RuleLocal::getStepParent<effrule>(current);
                    if (dad[j] != -1){
                        pp[2*j + 1] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] == 0){
                    pp[j] = -1;
                }else{
                    dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                    pp[j] = mset.getSlot(dad.data());
                    while((dad[j] != 0) && (pp[j] == -1)){
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }
}